

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void __thiscall cs::structure::~structure(structure *this)

{
  element_type *this_00;
  domain_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  pointer pcVar1;
  size_t sVar2;
  var *func;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  any local_50;
  key_arg<std::__cxx11::basic_string<char>_> local_48;
  any local_28;
  structure *local_20;
  
  if (this->m_shadow == false) {
    this_00 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    paVar3 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"finalize","");
    sVar2 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
            ::count<std::__cxx11::string>
                      ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                        *)this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar3) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (sVar2 != 0) {
      this_01 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      local_48._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"finalize","");
      func = domain_type::get_var(this_01,&local_48);
      local_20 = this;
      cs_impl::any::make<cs::structure,cs::structure*>(&local_50,&local_20);
      invoke<cs_impl::any>((cs *)&local_28,func,&local_50);
      cs_impl::any::recycle(&local_28);
      cs_impl::any::recycle(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar3) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  this_02 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar3 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~structure()
		{
			if (!m_shadow && m_data->exist("finalize"))
				invoke(m_data->get_var("finalize"), var::make<structure>(this));
		}